

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Omega_h_metric.cpp
# Opt level: O3

Reals __thiscall
Omega_h::clamp_metrics_dim<2>(Omega_h *this,LO nmetrics,Reals *metrics,Real h_min,Real h_max)

{
  int *piVar1;
  Alloc *pAVar2;
  undefined8 uVar3;
  void *extraout_RDX;
  void *extraout_RDX_00;
  void *extraout_RDX_01;
  void *extraout_RDX_02;
  void *extraout_RDX_03;
  void *pvVar4;
  Reals RVar5;
  Write<double> out;
  type functor;
  Write<double> local_88;
  Write<double> local_70;
  undefined1 local_60 [32];
  Alloc *local_40;
  void *local_38;
  Real local_30;
  Real local_28;
  
  local_60._0_8_ = local_60 + 0x10;
  local_30 = h_min;
  local_28 = h_max;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_60,"");
  Write<double>::Write(&local_88,nmetrics * 3,(string *)local_60);
  if ((undefined1 *)local_60._0_8_ != local_60 + 0x10) {
    operator_delete((void *)local_60._0_8_,local_60._16_8_ + 1);
  }
  local_60._0_8_ = (metrics->write_).shared_alloc_.alloc;
  if ((local_60._0_8_ & 7) == 0 && (Alloc *)local_60._0_8_ != (Alloc *)0x0) {
    if (entering_parallel == '\x01') {
      local_60._0_8_ = ((Alloc *)local_60._0_8_)->size * 8 + 1;
    }
    else {
      ((Alloc *)local_60._0_8_)->use_count = ((Alloc *)local_60._0_8_)->use_count + 1;
    }
  }
  local_60._8_8_ = (metrics->write_).shared_alloc_.direct_ptr;
  local_60._16_8_ = local_30;
  local_60._24_8_ = local_28;
  local_40 = local_88.shared_alloc_.alloc;
  if (((ulong)local_88.shared_alloc_.alloc & 7) == 0 && local_88.shared_alloc_.alloc != (Alloc *)0x0
     ) {
    if (entering_parallel == '\x01') {
      local_40 = (Alloc *)((local_88.shared_alloc_.alloc)->size * 8 + 1);
    }
    else {
      (local_88.shared_alloc_.alloc)->use_count = (local_88.shared_alloc_.alloc)->use_count + 1;
    }
  }
  local_38 = local_88.shared_alloc_.direct_ptr;
  parallel_for<Omega_h::clamp_metrics_dim<2>(int,Omega_h::Read<double>,double,double)::_lambda(int)_1_>
            (nmetrics,(type *)local_60,"clamp_metrics");
  local_70.shared_alloc_.alloc = local_88.shared_alloc_.alloc;
  local_70.shared_alloc_.direct_ptr = local_88.shared_alloc_.direct_ptr;
  if ((((ulong)local_88.shared_alloc_.alloc & 7) == 0 &&
       local_88.shared_alloc_.alloc != (Alloc *)0x0) && (entering_parallel == '\x01')) {
    (local_88.shared_alloc_.alloc)->use_count = (local_88.shared_alloc_.alloc)->use_count + -1;
    local_70.shared_alloc_.alloc = (Alloc *)((local_88.shared_alloc_.alloc)->size * 8 + 1);
  }
  local_88.shared_alloc_.alloc = (Alloc *)0x0;
  local_88.shared_alloc_.direct_ptr = (void *)0x0;
  Read<double>::Read((Read<signed_char> *)this,&local_70);
  pAVar2 = local_70.shared_alloc_.alloc;
  pvVar4 = extraout_RDX;
  if (((ulong)local_70.shared_alloc_.alloc & 7) == 0 && local_70.shared_alloc_.alloc != (Alloc *)0x0
     ) {
    piVar1 = &(local_70.shared_alloc_.alloc)->use_count;
    *piVar1 = *piVar1 + -1;
    if (*piVar1 == 0) {
      Alloc::~Alloc(local_70.shared_alloc_.alloc);
      operator_delete(pAVar2,0x48);
      pvVar4 = extraout_RDX_00;
    }
  }
  pAVar2 = local_40;
  if (((ulong)local_40 & 7) == 0 && local_40 != (Alloc *)0x0) {
    piVar1 = &local_40->use_count;
    *piVar1 = *piVar1 + -1;
    if (*piVar1 == 0) {
      Alloc::~Alloc(local_40);
      operator_delete(pAVar2,0x48);
      pvVar4 = extraout_RDX_01;
    }
  }
  uVar3 = local_60._0_8_;
  if ((local_60._0_8_ & 7) == 0 && (Alloc *)local_60._0_8_ != (Alloc *)0x0) {
    piVar1 = (int *)(local_60._0_8_ + 0x30);
    *piVar1 = *piVar1 + -1;
    if (*piVar1 == 0) {
      Alloc::~Alloc((Alloc *)local_60._0_8_);
      operator_delete((void *)uVar3,0x48);
      pvVar4 = extraout_RDX_02;
    }
  }
  pAVar2 = local_88.shared_alloc_.alloc;
  if (((ulong)local_88.shared_alloc_.alloc & 7) == 0 && local_88.shared_alloc_.alloc != (Alloc *)0x0
     ) {
    piVar1 = &(local_88.shared_alloc_.alloc)->use_count;
    *piVar1 = *piVar1 + -1;
    if (*piVar1 == 0) {
      Alloc::~Alloc(local_88.shared_alloc_.alloc);
      operator_delete(pAVar2,0x48);
      pvVar4 = extraout_RDX_03;
    }
  }
  RVar5.write_.shared_alloc_.direct_ptr = pvVar4;
  RVar5.write_.shared_alloc_.alloc = (Alloc *)this;
  return (Reals)RVar5.write_.shared_alloc_;
}

Assistant:

Reals clamp_metrics_dim(
    LO nmetrics, Reals metrics, Real h_min, Real h_max) {
  auto out = Write<Real>(nmetrics * symm_ncomps(dim));
  auto functor = OMEGA_H_LAMBDA(LO i) {
    auto m = get_symm<dim>(metrics, i);
    m = clamp_metric(m, h_min, h_max);
    set_symm(out, i, m);
  };
  parallel_for("clamp_metrics", nmetrics, std::move(functor));
  return out;
}